

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDVertex::CreasedEdgeCount
          (ON_SubDVertex *this,bool bCountInteriorCreases,bool bCountBoundaryCreases,
          bool bCountNonmanifoldCreases,bool bCountWireCreases)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((ulong)this->m_edge_count != 0) {
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar4 = this->m_edges[uVar3].m_ptr & 0xfffffffffffffff8;
      if ((uVar4 != 0) && (*(char *)(uVar4 + 0x60) == '\x02')) {
        sVar1 = *(short *)(uVar4 + 100);
        if (sVar1 == 2) {
          uVar2 = uVar2 + bCountInteriorCreases;
        }
        else if (sVar1 == 1) {
          uVar2 = uVar2 + bCountBoundaryCreases;
        }
        else if (sVar1 == 0) {
          uVar2 = uVar2 + bCountWireCreases;
        }
        else {
          uVar2 = uVar2 + bCountNonmanifoldCreases;
        }
      }
      uVar3 = uVar3 + 1;
    } while (this->m_edge_count != uVar3);
    return uVar2;
  }
  return 0;
}

Assistant:

const unsigned int ON_SubDVertex::CreasedEdgeCount(
  bool bCountInteriorCreases, 
  bool bCountBoundaryCreases, 
  bool bCountNonmanifoldCreases,
  bool bCountWireCreases
) const
{
  unsigned creased_edge_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      continue;
    if (ON_SubDEdgeTag::Crease != e->m_edge_tag)
      continue;
    switch (e->m_face_count)
    {
    case 0:
      if (bCountWireCreases)
        ++creased_edge_count;
      break;
    case 1:
      if (bCountBoundaryCreases)
        ++creased_edge_count;
      break;
    case 2:
      if (bCountInteriorCreases)
        ++creased_edge_count;
      break;
    default:
      if (bCountNonmanifoldCreases)
        ++creased_edge_count;
      break;
    }
  }
  return creased_edge_count;
}